

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

string * __thiscall
pbrt::Integrator::ToString_abi_cxx11_(string *__return_storage_ptr__,Integrator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  string *psVar3;
  Integrator *pIVar4;
  pointer pLVar5;
  string ret_1;
  string s;
  string local_a0;
  string *local_80;
  string local_78;
  string local_58;
  Integrator *local_38;
  
  local_a0._M_dataplus._M_p =
       (pointer)((long)(this->lights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->lights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_80 = __return_storage_ptr__;
  detail::
  stringPrintfRecursive<pbrt::PrimitiveHandle_const&,pbrt::Bounds3<float>const&,unsigned_long>
            (&local_78,"[ Scene aggregate: %s sceneBounds: %s lights[%d]: [ ",&this->aggregate,
             &this->sceneBounds,(unsigned_long *)&local_a0);
  pLVar5 = (this->lights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->lights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pLVar5 != pLVar2) {
    do {
      LightHandle::ToString_abi_cxx11_(&local_58,pLVar5);
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string>(&local_a0,"%s, ",&local_58);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = pLVar5 + 1;
    } while (pLVar5 != pLVar2);
  }
  pIVar4 = local_38;
  local_58._M_dataplus._M_p =
       (pointer)((long)(local_38->infiniteLights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_38->infiniteLights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  paVar1 = &local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  detail::stringPrintfRecursive<unsigned_long>
            (&local_a0,"] infiniteLights[%d]: [ ",(unsigned_long *)&local_58);
  std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  pLVar5 = (pIVar4->infiniteLights).
           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (pIVar4->infiniteLights).
           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar5 != pLVar2) {
    do {
      LightHandle::ToString_abi_cxx11_(&local_58,pLVar5);
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string>(&local_a0,"%s, ",&local_58);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = pLVar5 + 1;
    } while (pLVar5 != pLVar2);
  }
  psVar3 = local_80;
  (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  std::__cxx11::string::append((char *)psVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return local_80;
}

Assistant:

std::string Integrator::ToString() const {
    std::string s = StringPrintf("[ Scene aggregate: %s sceneBounds: %s lights[%d]: [ ",
                                 aggregate, sceneBounds, lights.size());
    for (const auto &l : lights)
        s += StringPrintf("%s, ", l.ToString());
    s += StringPrintf("] infiniteLights[%d]: [ ", infiniteLights.size());
    for (const auto &l : infiniteLights)
        s += StringPrintf("%s, ", l.ToString());
    return s + " ]";
}